

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_paeth_predictor_8x8_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [16];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  int iVar13;
  bool bVar14;
  short extraout_XMM0_Wa;
  short extraout_XMM0_Wb;
  short extraout_XMM0_Wc;
  short extraout_XMM0_Wd;
  short extraout_XMM0_We;
  short extraout_XMM0_Wf;
  short extraout_XMM0_Wg;
  undefined1 auVar15 [16];
  short extraout_XMM0_Wh;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  __m128i l16;
  __m128i tl16;
  __m128i t16;
  
  uVar1 = *(ulong *)left;
  uVar2 = *(ulong *)above;
  auVar3._8_6_ = 0;
  auVar3._0_8_ = uVar2;
  auVar3[0xe] = (char)(uVar2 >> 0x38);
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar2;
  auVar4[0xc] = (char)(uVar2 >> 0x30);
  auVar4._13_2_ = auVar3._13_2_;
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar2;
  auVar5._12_3_ = auVar4._12_3_;
  auVar6._8_2_ = 0;
  auVar6._0_8_ = uVar2;
  auVar6[10] = (char)(uVar2 >> 0x28);
  auVar6._11_4_ = auVar5._11_4_;
  auVar7._8_2_ = 0;
  auVar7._0_8_ = uVar2;
  auVar7._10_5_ = auVar6._10_5_;
  auVar8[8] = (char)(uVar2 >> 0x20);
  auVar8._0_8_ = uVar2;
  auVar8._9_6_ = auVar7._9_6_;
  auVar10._7_8_ = 0;
  auVar10._0_7_ = auVar8._8_7_;
  auVar11._1_8_ = SUB158(auVar10 << 0x40,7);
  auVar11[0] = (char)(uVar2 >> 0x18);
  auVar11._9_6_ = 0;
  auVar12._1_10_ = SUB1510(auVar11 << 0x30,5);
  auVar12[0] = (char)(uVar2 >> 0x10);
  auVar12._11_4_ = 0;
  t16._3_12_ = SUB1512(auVar12 << 0x20,3);
  t16[0]._2_1_ = (char)(uVar2 >> 8);
  t16[0]._0_2_ = (ushort)(byte)uVar2;
  t16[1]._7_1_ = 0;
  auVar15 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  tl16[0]._0_4_ = auVar15._0_4_;
  iVar13 = 8;
  auVar15 = _DAT_00435e80;
  tl16[0]._4_4_ = (undefined4)tl16[0];
  tl16[1]._0_4_ = (undefined4)tl16[0];
  tl16[1]._4_4_ = (undefined4)tl16[0];
  while (bVar14 = iVar13 != 0, iVar13 = iVar13 + -1, bVar14) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar1;
    l16 = (__m128i)pshufb(auVar9,auVar15);
    paeth_8x1_pred(&l16,&t16,&tl16);
    local_78 = auVar15._0_2_;
    sStack_76 = auVar15._2_2_;
    sStack_74 = auVar15._4_2_;
    sStack_72 = auVar15._6_2_;
    sStack_70 = auVar15._8_2_;
    sStack_6e = auVar15._10_2_;
    sStack_6c = auVar15._12_2_;
    sStack_6a = auVar15._14_2_;
    *(ulong *)dst =
         CONCAT17((0 < extraout_XMM0_Wh) * (extraout_XMM0_Wh < 0x100) * (char)extraout_XMM0_Wh -
                  (0xff < extraout_XMM0_Wh),
                  CONCAT16((0 < extraout_XMM0_Wg) * (extraout_XMM0_Wg < 0x100) *
                           (char)extraout_XMM0_Wg - (0xff < extraout_XMM0_Wg),
                           CONCAT15((0 < extraout_XMM0_Wf) * (extraout_XMM0_Wf < 0x100) *
                                    (char)extraout_XMM0_Wf - (0xff < extraout_XMM0_Wf),
                                    CONCAT14((0 < extraout_XMM0_We) * (extraout_XMM0_We < 0x100) *
                                             (char)extraout_XMM0_We - (0xff < extraout_XMM0_We),
                                             CONCAT13((0 < extraout_XMM0_Wd) *
                                                      (extraout_XMM0_Wd < 0x100) *
                                                      (char)extraout_XMM0_Wd -
                                                      (0xff < extraout_XMM0_Wd),
                                                      CONCAT12((0 < extraout_XMM0_Wc) *
                                                               (extraout_XMM0_Wc < 0x100) *
                                                               (char)extraout_XMM0_Wc -
                                                               (0xff < extraout_XMM0_Wc),
                                                               CONCAT11((0 < extraout_XMM0_Wb) *
                                                                        (extraout_XMM0_Wb < 0x100) *
                                                                        (char)extraout_XMM0_Wb -
                                                                        (0xff < extraout_XMM0_Wb),
                                                                        (0 < extraout_XMM0_Wa) *
                                                                        (extraout_XMM0_Wa < 0x100) *
                                                                        (char)extraout_XMM0_Wa -
                                                                        (0xff < extraout_XMM0_Wa))))
                                            ))));
    dst = dst + stride;
    auVar15._0_2_ = local_78 + 1;
    auVar15._2_2_ = sStack_76 + 1;
    auVar15._4_2_ = sStack_74 + 1;
    auVar15._6_2_ = sStack_72 + 1;
    auVar15._8_2_ = sStack_70 + 1;
    auVar15._10_2_ = sStack_6e + 1;
    auVar15._12_2_ = sStack_6c + 1;
    auVar15._14_2_ = sStack_6a + 1;
  }
  return;
}

Assistant:

void aom_paeth_predictor_8x8_ssse3(uint8_t *dst, ptrdiff_t stride,
                                   const uint8_t *above, const uint8_t *left) {
  __m128i l = _mm_loadl_epi64((const __m128i *)left);
  const __m128i t = _mm_loadl_epi64((const __m128i *)above);
  const __m128i zero = _mm_setzero_si128();
  const __m128i t16 = _mm_unpacklo_epi8(t, zero);
  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);

  int i;
  for (i = 0; i < 8; ++i) {
    const __m128i l16 = _mm_shuffle_epi8(l, rep);
    const __m128i row = paeth_8x1_pred(&l16, &t16, &tl16);

    _mm_storel_epi64((__m128i *)dst, _mm_packus_epi16(row, row));
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}